

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,logic_t bit)

{
  logic_t *plVar1;
  EVP_PKEY_CTX *in_RSI;
  Token *in_RDI;
  uint8_t in_stack_00000018;
  
  NumericTokenFlags::NumericTokenFlags(&in_RDI->numFlags);
  in_RDI->rawLen = 0;
  in_RDI->info = (Info *)0x0;
  init(in_RDI,in_RSI);
  plVar1 = Info::bit((Info *)0x546bf5);
  plVar1->value = in_stack_00000018;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, logic_t bit) {
    SLANG_ASSERT(kind == TokenKind::UnbasedUnsizedLiteral);
    init(alloc, kind, trivia, rawText, location);
    info->bit() = bit;
}